

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O2

MPP_RET h265d_get_stream(void *ctx,RK_U8 **buf,RK_S32 *size)

{
  long lVar1;
  
  lVar1 = *ctx;
  *buf = *(RK_U8 **)(lVar1 + 0x1128);
  *size = *(RK_S32 *)(lVar1 + 0x1130);
  return MPP_OK;
}

Assistant:

MPP_RET h265d_get_stream(void *ctx, RK_U8 **buf, RK_S32 *size)
{
    MPP_RET ret = MPP_OK;
    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    HEVCContext *s = h265dctx->priv_data;
    *buf = s->checksum_buf;
    *size = s->checksum_buf_size;
    return ret;
}